

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O0

void __thiscall Random_keys::ordenaPopulacaoAtual(Random_keys *this,Graph *g)

{
  size_type sVar1;
  reference ppRVar2;
  iterator __first;
  iterator __last;
  uint local_1c;
  uint i;
  Graph *g_local;
  Random_keys *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::size(&this->popAtual);
    if (sVar1 <= local_1c) break;
    ppRVar2 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                        (&this->popAtual,(ulong)local_1c);
    RK_Individual::calculaFuncaoObjetivoOtimizado(*ppRVar2,g);
    local_1c = local_1c + 1;
  }
  __first = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::begin(&this->popAtual);
  __last = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::end(&this->popAtual);
  std::
  sort<__gnu_cxx::__normal_iterator<RK_Individual**,std::vector<RK_Individual*,std::allocator<RK_Individual*>>>,bool(*)(RK_Individual*,RK_Individual*)>
            ((__normal_iterator<RK_Individual_**,_std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>_>
              )__first._M_current,
             (__normal_iterator<RK_Individual_**,_std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>_>
              )__last._M_current,ordenacaoIndividuo);
  return;
}

Assistant:

void Random_keys::ordenaPopulacaoAtual(Graph *g){
    for(unsigned int i=0; i<popAtual.size(); i++)
        popAtual.at(i)->calculaFuncaoObjetivoOtimizado(g);
//        popAtual.at(i)->calculaFuncaoObjetivo(g);

    sort(popAtual.begin(), popAtual.end(), ordenacaoIndividuo);
}